

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O3

void duckdb::RLEScanConstant<float>
               (RLEScanState<float> *scan_state,rle_count_t *index_pointer,float *data_pointer,
               idx_t scan_count,Vector *result)

{
  idx_t iVar1;
  ulong uVar2;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  iVar1 = scan_state->entry_pos;
  *(float *)result->data = data_pointer[iVar1];
  uVar2 = scan_count + scan_state->position_in_entry;
  scan_state->position_in_entry = uVar2;
  if (index_pointer[iVar1] <= uVar2) {
    scan_state->entry_pos = iVar1 + 1;
    scan_state->position_in_entry = 0;
  }
  return;
}

Assistant:

static void RLEScanConstant(RLEScanState<T> &scan_state, rle_count_t *index_pointer, T *data_pointer, idx_t scan_count,
                            Vector &result) {
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	auto result_data = ConstantVector::GetData<T>(result);
	result_data[0] = data_pointer[scan_state.entry_pos];
	scan_state.position_in_entry += scan_count;
	if (scan_state.ExhaustedRun(index_pointer)) {
		scan_state.ForwardToNextRun();
	}
	return;
}